

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_decode_options<wchar_t> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  *this_00;
  ushort uVar1;
  int iVar2;
  _func_int *p_Var3;
  double local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *local_38;
  
  (this->super_ser_context)._vptr_ser_context = (_func_int **)&PTR__basic_json_parser_009a1070;
  this->max_nesting_depth_ =
       *(int *)(&options->field_0xd0 + (long)options->_vptr_basic_json_decode_options[-3]);
  this->allow_trailing_comma_ = options->allow_trailing_comma_;
  this->allow_comments_ = options->allow_comments_;
  this->lossless_number_ = options->lossless_number_;
  local_38 = &this->err_handler_;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            (local_38,err_handler);
  this->level_ = 0;
  this->cp_ = 0;
  this->cp2_ = 0;
  this->line_ = 1;
  this->position_ = 0;
  this->mark_position_ = 0;
  this->begin_position_ = 0;
  this->begin_input_ = (char_type_conflict *)0x0;
  this->end_input_ = (char_type_conflict *)0x0;
  this->input_ptr_ = (char_type_conflict *)0x0;
  this->state_ = start;
  this->string_state_ = text;
  this->number_state_ = minus;
  this->more_ = true;
  this->done_ = false;
  this->cursor_mode_ = false;
  this->mark_level_ = 0;
  (this->string_buffer_)._M_dataplus._M_p = (pointer)&(this->string_buffer_).field_2;
  (this->string_buffer_)._M_string_length = 0;
  (this->string_buffer_).field_2._M_local_buf[0] = L'\0';
  detail::chars_to::chars_to(&this->to_double_);
  this_00 = &this->string_double_map_;
  (this->string_double_map_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->string_double_map_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->string_double_map_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::wstring::reserve((ulong)&this->string_buffer_);
  iVar2 = 0x42;
  if (*(int *)(&options->field_0xd0 + (long)options->_vptr_basic_json_decode_options[-3]) < 0x41) {
    iVar2 = *(int *)(&options->field_0xd0 + (long)options->_vptr_basic_json_decode_options[-3]) + 2;
  }
  std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::reserve
            (&this->state_stack_,(long)iVar2);
  push_state(this,root);
  p_Var3 = options->_vptr_basic_json_decode_options[-3];
  uVar1 = *(ushort *)(&options->lossless_number_ + (long)p_Var3);
  if ((uVar1 & 0x40) != 0) {
    std::__cxx11::wstring::wstring
              ((wstring *)&local_58,(wstring *)(&options->field_0x70 + (long)p_Var3));
    local_60 = nan("");
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::__cxx11::wstring,double>
              ((vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
                *)this_00,&local_58,&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_58);
    p_Var3 = options->_vptr_basic_json_decode_options[-3];
    uVar1 = *(ushort *)(&options->lossless_number_ + (long)p_Var3);
  }
  if ((char)uVar1 < '\0') {
    std::__cxx11::wstring::wstring
              ((wstring *)&local_58,(wstring *)(&options->field_0x90 + (long)p_Var3));
    local_60 = INFINITY;
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::__cxx11::wstring,double>
              ((vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
                *)this_00,&local_58,&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_58);
    p_Var3 = options->_vptr_basic_json_decode_options[-3];
    uVar1 = *(ushort *)(&options->lossless_number_ + (long)p_Var3);
  }
  if ((uVar1 & 0x180) != 0) {
    basic_json_options_common<wchar_t>::neginf_to_str_abi_cxx11_
              (&local_58,
               (basic_json_options_common<wchar_t> *)
               ((long)&options->_vptr_basic_json_decode_options + (long)p_Var3));
    local_60 = -INFINITY;
    std::
    vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
    ::emplace_back<std::__cxx11::wstring,double>
              ((vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
                *)this_00,&local_58,&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_58);
  }
  return;
}

Assistant:

basic_json_parser(const basic_json_decode_options<char_type>& options,
                      std::function<bool(json_errc,const ser_context&)> err_handler, 
                      const TempAllocator& temp_alloc = TempAllocator())
       : max_nesting_depth_(options.max_nesting_depth()),
         allow_trailing_comma_(options.allow_trailing_comma()),
         allow_comments_(options.allow_comments()),
         lossless_number_(options.lossless_number()),
         err_handler_(err_handler),
         string_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        string_buffer_.reserve(initial_string_buffer_capacity);

        std::size_t initial_stack_capacity = options.max_nesting_depth() <= (default_initial_stack_capacity-2) ? (options.max_nesting_depth()+2) : default_initial_stack_capacity;
        state_stack_.reserve(initial_stack_capacity );
        push_state(parse_state::root);

        if (options.enable_str_to_nan())
        {
            string_double_map_.emplace_back(options.nan_to_str(),std::nan(""));
        }
        if (options.enable_str_to_inf())
        {
            string_double_map_.emplace_back(options.inf_to_str(),std::numeric_limits<double>::infinity());
        }
        if (options.enable_str_to_neginf())
        {
            string_double_map_.emplace_back(options.neginf_to_str(),-std::numeric_limits<double>::infinity());
        }
    }